

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.cpp
# Opt level: O1

bool __thiscall CMU462::StaticScene::Sphere::intersect(Sphere *this,Ray *ray,Intersection *isect)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double t2;
  double t1;
  double local_38;
  double local_30;
  double local_28;
  double dStack_20;
  
  bVar1 = test(this,ray,&local_30,&local_38);
  if (bVar1) {
    dVar5 = (double)(~-(ulong)(local_30 < 0.0) & (ulong)local_30 |
                    (ulong)local_38 & -(ulong)(local_30 < 0.0));
    bVar1 = false;
    if ((dVar5 <= ray->max_t) && (bVar1 = false, ray->min_t <= dVar5)) {
      ray->max_t = dVar5;
      isect->t = dVar5;
      dVar6 = ((ray->d).z * dVar5 + (ray->o).z) - (this->o).z;
      dVar4 = (dVar5 * (ray->d).x + (ray->o).x) - (this->o).x;
      dVar5 = (dVar5 * (ray->d).y + (ray->o).y) - (this->o).y;
      dVar3 = dVar6 * dVar6 + dVar4 * dVar4 + dVar5 * dVar5;
      if (dVar3 < 0.0) {
        local_28 = dVar4;
        dStack_20 = dVar5;
        dVar3 = sqrt(dVar3);
        dVar4 = local_28;
        dVar5 = dStack_20;
      }
      else {
        dVar3 = SQRT(dVar3);
      }
      dVar3 = 1.0 / dVar3;
      (isect->n).x = dVar4 * dVar3;
      (isect->n).y = dVar5 * dVar3;
      (isect->n).z = dVar6 * dVar3;
      iVar2 = (*(this->super_Primitive)._vptr_Primitive[3])(this);
      isect->bsdf = (BSDF *)CONCAT44(extraout_var,iVar2);
      isect->primitive = &this->super_Primitive;
      bVar1 = true;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Sphere::intersect(const Ray& ray, Intersection* isect) const {
		// TODO (PathTracer):
		// Implement ray - sphere intersection.
		// Note again that you might want to use the the Sphere::test helper here.
		// When an intersection takes place, the Intersection data should be updated
		// correspondingly.
		double t1, t2, first_hit;
		bool result = test(ray, t1, t2);

		// take into consideration when the origin of the
		// ray is inside the sphere
		if (t1 < 0) first_hit = t2;
		else first_hit = t1;

		if (result && first_hit <= ray.max_t && first_hit >= ray.min_t) {
			ray.max_t = first_hit;

			isect->t = first_hit;
			isect->n = normal(ray.o+ray.d*first_hit);
			isect->bsdf = get_bsdf();
			isect->primitive = this;

			return true;
		}
		else return false;
	}